

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::dispatch::Bound_Function::do_call
          (Bound_Function *this,Function_Params *params,Type_Conversions_State *t_conversions)

{
  element_type *params_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar1;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> local_50;
  Function_Params local_38;
  Type_Conversions_State *t_conversions_local;
  Function_Params *params_local;
  Bound_Function *this_local;
  
  t_conversions_local = t_conversions;
  params_local = params;
  this_local = this;
  params_00 = std::
              __shared_ptr_access<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&params[2].m_end);
  build_param_list(&local_50,(Bound_Function *)params,(Function_Params *)t_conversions_local);
  Function_Params::Function_Params(&local_38,&local_50);
  Proxy_Function_Base::operator()
            (&this->super_Proxy_Function_Base,(Function_Params *)params_00,
             (Type_Conversions_State *)&local_38);
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::~vector(&local_50)
  ;
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value do_call(const Function_Params &params, const Type_Conversions_State &t_conversions) const override {
        return (*m_f)(Function_Params{build_param_list(params)}, t_conversions);
      }